

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_event.cpp
# Opt level: O2

void __thiscall sc_core::sc_event_list::push_back(sc_event_list *this,sc_event_list *el)

{
  ulong uVar1;
  
  std::vector<const_sc_core::sc_event_*,_std::allocator<const_sc_core::sc_event_*>_>::reserve
            ((vector<const_sc_core::sc_event_*,_std::allocator<const_sc_core::sc_event_*>_> *)this,
             (long)((int)((ulong)(*(long *)(el + 8) - *(long *)el) >> 3) +
                   (int)((ulong)(*(long *)(this + 8) - *(long *)this) >> 3)));
  uVar1 = (ulong)(*(long *)(el + 8) - *(long *)el) >> 3 & 0xffffffff;
  while( true ) {
    uVar1 = uVar1 - 1;
    if ((int)(uint)uVar1 < 0) break;
    push_back(this,*(sc_event **)(*(long *)el + (ulong)((uint)uVar1 & 0x7fffffff) * 8));
  }
  auto_delete(el);
  return;
}

Assistant:

void
sc_event_list::push_back( const sc_event_list& el )
{
    m_events.reserve( size() + el.size() );
    for ( int i = el.m_events.size() - 1; i >= 0; --i )
    {
        push_back( *el.m_events[i] );
    }
    el.auto_delete();
}